

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O1

string * __thiscall
notch::io::PlainTextNetworkReader::read_tag_abi_cxx11_
          (string *__return_storage_ptr__,PlainTextNetworkReader *this,istream *in)

{
  istream *piVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  piVar1 = std::ws<char,std::char_traits<char>>(in);
  piVar1 = std::operator>>(piVar1,(string *)__return_storage_ptr__);
  std::ws<char,std::char_traits<char>>(piVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string read_tag(std::istream &in) {
        std::string tag;
        in >> std::ws >> tag >> std::ws;
        return tag;
    }